

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::TextureUnitCase::render(TextureUnitCase *this,Context *context)

{
  int texNdx;
  uint uVar1;
  deUint32 dVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> textureGLNames;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  vector<bool,_std::allocator<bool>_> local_78;
  Vec3 local_50;
  Vec3 local_40;
  
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40.m_data._0_8_ = local_40.m_data._0_8_ & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_78,(long)this->m_numTextures,(bool *)&local_40,(allocator_type *)&local_50);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&local_a8,(long)this->m_numTextures);
  (*context->_vptr_Context[7])
            (context,(ulong)(uint)this->m_numTextures,
             local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  dVar2 = (*context->_vptr_Context[0x79])(context);
  glu::checkError(dVar2,"Generate textures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureUnitTests.cpp"
                  ,0x48f);
  if (0 < this->m_numUnits) {
    lVar6 = 0;
    local_80 = 0x800000000000003f;
    do {
      texNdx = (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar6];
      uVar4 = (ulong)texNdx;
      (*context->_vptr_Context[4])(context,(ulong)((int)lVar6 + 0x84c0));
      dVar2 = (*context->_vptr_Context[0x79])(context);
      glu::checkError(dVar2,"Set active texture",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureUnitTests.cpp"
                      ,0x497);
      (*context->_vptr_Context[6])
                (context,(ulong)(this->m_textureTypes).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar4],
                 (ulong)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar4]);
      dVar2 = (*context->_vptr_Context[0x79])(context);
      glu::checkError(dVar2,"Bind texture",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureUnitTests.cpp"
                      ,0x499);
      iVar3 = texNdx + 0x3f;
      if (-1 < texNdx) {
        iVar3 = texNdx;
      }
      uVar5 = (ulong)((uVar4 & local_80) < 0x8000000000000001);
      if ((local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[(long)(iVar3 >> 6) + (uVar5 - 1)] >>
           (uVar4 & 0x3f) & 1) == 0) {
        local_90 = 1L << ((byte)texNdx & 0x3f);
        local_88 = uVar5;
        (*context->_vptr_Context[0x1d])
                  (context,(ulong)(this->m_textureTypes).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar4],0x2802,
                   (ulong)(this->m_textureParams).
                          super__Vector_base<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar4].wrapModeS);
        (*context->_vptr_Context[0x1d])
                  (context,(ulong)(this->m_textureTypes).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar4],0x2803,
                   (ulong)(this->m_textureParams).
                          super__Vector_base<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar4].wrapModeT);
        uVar1 = (this->m_textureTypes).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar4];
        if (uVar1 == 0x806f) {
          (*context->_vptr_Context[0x1d])
                    (context,0x806f,0x8072,
                     (ulong)(this->m_textureParams).
                            super__Vector_base<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar4].wrapModeR);
          uVar1 = (this->m_textureTypes).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar4];
        }
        (*context->_vptr_Context[0x1d])
                  (context,(ulong)uVar1,0x2801,
                   (ulong)(this->m_textureParams).
                          super__Vector_base<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar4].minFilter);
        (*context->_vptr_Context[0x1d])
                  (context,(ulong)(this->m_textureTypes).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar4],0x2800,
                   (ulong)(this->m_textureParams).
                          super__Vector_base<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar4].magFilter);
        dVar2 = (*context->_vptr_Context[0x79])(context);
        glu::checkError(dVar2,"Set texture parameters",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureUnitTests.cpp"
                        ,0x4a5);
        uVar1 = (this->m_textureTypes).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar4];
        if ((int)uVar1 < 0x8513) {
          if (uVar1 == 0xde1) {
            upload2dTexture(this,texNdx,context);
          }
          else if (uVar1 == 0x806f) {
            upload3dTexture(this,texNdx,context);
          }
        }
        else if (uVar1 == 0x8513) {
          uploadCubeTexture(this,texNdx,context);
        }
        else if (uVar1 == 0x8c1a) {
          upload2dArrayTexture(this,texNdx,context);
        }
        local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p[(long)(iVar3 >> 6) + (local_88 - 1)] =
             local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[(long)(iVar3 >> 6) + (local_88 - 1)] | local_90;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < this->m_numUnits);
  }
  dVar2 = (*context->_vptr_Context[0x79])(context);
  glu::checkError(dVar2,"Set textures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureUnitTests.cpp"
                  ,0x4b5);
  dVar2 = (*context->_vptr_Context[0x75])(context,this->m_shader);
  (*context->_vptr_Context[0x2a])(0x3e000000,0x3e800000,0x3f000000,0x3f800000,context);
  (*context->_vptr_Context[0x2d])(context,0x4500);
  MultiTexShader::setUniforms(this->m_shader,context,dVar2);
  local_40.m_data[0] = -1.0;
  local_40.m_data[1] = -1.0;
  local_40.m_data[2] = 0.0;
  local_50.m_data[0] = 1.0;
  local_50.m_data[1] = 1.0;
  local_50.m_data[2] = 0.0;
  sglr::drawQuad(context,dVar2,&local_40,&local_50);
  dVar2 = (*context->_vptr_Context[0x79])(context);
  glu::checkError(dVar2,"Draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureUnitTests.cpp"
                  ,0x4c1);
  (*context->_vptr_Context[8])
            (context,(ulong)(uint)this->m_numTextures,
             local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  dVar2 = (*context->_vptr_Context[0x79])(context);
  glu::checkError(dVar2,"Delete textures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureUnitTests.cpp"
                  ,0x4c6);
  if (local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TextureUnitCase::render (sglr::Context& context)
{
	// Setup textures.

	vector<deUint32>	textureGLNames;
	vector<bool>		isTextureSetUp(m_numTextures, false); // \note Same texture may be bound to multiple units, but we only want to set up parameters and data once per texture.

	textureGLNames.resize(m_numTextures);
	context.genTextures(m_numTextures, &textureGLNames[0]);
	GLU_EXPECT_NO_ERROR(context.getError(), "Generate textures");

	for (int unitNdx = 0; unitNdx < m_numUnits; unitNdx++)
	{
		int texNdx = m_unitTextures[unitNdx];

		// Bind texture to unit.
		context.activeTexture(GL_TEXTURE0 + unitNdx);
		GLU_EXPECT_NO_ERROR(context.getError(), "Set active texture");
		context.bindTexture(m_textureTypes[texNdx], textureGLNames[texNdx]);
		GLU_EXPECT_NO_ERROR(context.getError(), "Bind texture");

		if (!isTextureSetUp[texNdx])
		{
			// Binding this texture for first time, so set parameters and data.

			context.texParameteri(m_textureTypes[texNdx], GL_TEXTURE_WRAP_S, m_textureParams[texNdx].wrapModeS);
			context.texParameteri(m_textureTypes[texNdx], GL_TEXTURE_WRAP_T, m_textureParams[texNdx].wrapModeT);
			if (m_textureTypes[texNdx] == GL_TEXTURE_3D)
				context.texParameteri(m_textureTypes[texNdx], GL_TEXTURE_WRAP_R, m_textureParams[texNdx].wrapModeR);
			context.texParameteri(m_textureTypes[texNdx], GL_TEXTURE_MIN_FILTER, m_textureParams[texNdx].minFilter);
			context.texParameteri(m_textureTypes[texNdx], GL_TEXTURE_MAG_FILTER, m_textureParams[texNdx].magFilter);
			GLU_EXPECT_NO_ERROR(context.getError(), "Set texture parameters");

			switch (m_textureTypes[texNdx])
			{
				case GL_TEXTURE_2D:			upload2dTexture(texNdx, context);		break;
				case GL_TEXTURE_CUBE_MAP:	uploadCubeTexture(texNdx, context);		break;
				case GL_TEXTURE_2D_ARRAY:	upload2dArrayTexture(texNdx, context);	break;
				case GL_TEXTURE_3D:			upload3dTexture(texNdx, context);		break;
				default:
					DE_ASSERT(DE_FALSE);
			}

			isTextureSetUp[texNdx] = true; // Don't set up this texture's parameters and data again later.
		}
	}

	GLU_EXPECT_NO_ERROR(context.getError(), "Set textures");

	// Setup shader

	deUint32 shaderID = context.createProgram(m_shader);

	// Draw.

	context.clearColor(0.125f, 0.25f, 0.5f, 1.0f);
	context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	m_shader->setUniforms(context, shaderID);
	sglr::drawQuad(context, shaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
	GLU_EXPECT_NO_ERROR(context.getError(), "Draw");

	// Delete previously generated texture names.

	context.deleteTextures(m_numTextures, &textureGLNames[0]);
	GLU_EXPECT_NO_ERROR(context.getError(), "Delete textures");
}